

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::Loggers::reconfigureAllLoggers(Configurations *configurations)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  RegisteredLoggers *pRVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer ppVar5;
  _Self local_20;
  _Self local_18;
  iterator it;
  Configurations *configurations_local;
  
  it._M_node = (_Base_ptr)configurations;
  peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)el::base::elStorage);
  pRVar4 = el::base::Storage::registeredLoggers(peVar3);
  iVar2 = (*(pRVar4->
            super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).
            super_AbstractRegistry<el::Logger,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])();
  local_18._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar2);
  while( true ) {
    peVar3 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)el::base::elStorage);
    pRVar4 = el::base::Storage::registeredLoggers(peVar3);
    iVar2 = (*(pRVar4->
              super_Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super_AbstractRegistry<el::Logger,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])();
    local_20._M_node = (_Base_ptr)CONCAT44(extraout_var_00,iVar2);
    bVar1 = el::base::utils::std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar5 = el::base::utils::std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>
             ::operator->(&local_18);
    reconfigureLogger(ppVar5->second,(Configurations *)it._M_node);
    el::base::utils::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void Loggers::reconfigureAllLoggers(const Configurations& configurations) {
  for (base::RegisteredLoggers::iterator it = ELPP->registeredLoggers()->begin();
       it != ELPP->registeredLoggers()->end(); ++it) {
    Loggers::reconfigureLogger(it->second, configurations);
  }
}